

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_propagator.cpp
# Opt level: O2

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalOperator *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  byte bVar1;
  Optimizer *pOVar2;
  bool bVar3;
  LogicalProjection *node_ptr_00;
  LogicalGet *node_ptr_01;
  LogicalOrder *node_ptr_02;
  LogicalWindow *node_ptr_03;
  LogicalAggregate *node_ptr_04;
  LogicalFilter *node_ptr_05;
  LogicalCrossProduct *node_ptr_06;
  LogicalPositionalJoin *node_ptr_07;
  LogicalOperator *root_p;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RCX;
  CompressedMaterialization compressed_materialization;
  
  this->optimizer = (Optimizer *)0x0;
  bVar1 = *(byte *)&node_ptr[1].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  switch(bVar1) {
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x38:
    PropagateStatistics((StatisticsPropagator *)&compressed_materialization,(LogicalJoin *)node,
                        node_ptr);
    break;
  case 0x36:
    node_ptr_06 = LogicalOperator::Cast<duckdb::LogicalCrossProduct>((LogicalOperator *)node_ptr);
    PropagateStatistics((StatisticsPropagator *)&compressed_materialization,
                        (LogicalCrossProduct *)node,
                        (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)node_ptr_06);
    break;
  case 0x37:
    node_ptr_07 = LogicalOperator::Cast<duckdb::LogicalPositionalJoin>((LogicalOperator *)node_ptr);
    PropagateStatistics((StatisticsPropagator *)&compressed_materialization,
                        (LogicalPositionalJoin *)node,
                        (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                         *)node_ptr_07);
    break;
  default:
    switch(bVar1) {
    case 1:
      node_ptr_00 = LogicalOperator::Cast<duckdb::LogicalProjection>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&compressed_materialization,
                          (LogicalProjection *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_00);
      break;
    case 2:
      node_ptr_05 = LogicalOperator::Cast<duckdb::LogicalFilter>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&compressed_materialization,(LogicalFilter *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_05);
      break;
    case 3:
      node_ptr_04 = LogicalOperator::Cast<duckdb::LogicalAggregate>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&compressed_materialization,
                          (LogicalAggregate *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_04);
      break;
    case 4:
      node_ptr_03 = LogicalOperator::Cast<duckdb::LogicalWindow>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&compressed_materialization,(LogicalWindow *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_03);
      break;
    case 7:
      node_ptr_02 = LogicalOperator::Cast<duckdb::LogicalOrder>((LogicalOperator *)node_ptr);
      PropagateStatistics((StatisticsPropagator *)&compressed_materialization,(LogicalOrder *)node,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)node_ptr_02);
      break;
    default:
      if (bVar1 - 0x4b < 3) {
        PropagateStatistics((StatisticsPropagator *)&compressed_materialization,
                            (LogicalSetOperation *)node,node_ptr);
        break;
      }
      if (bVar1 == 0x19) {
        node_ptr_01 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)node_ptr);
        PropagateStatistics((StatisticsPropagator *)&compressed_materialization,(LogicalGet *)node,
                            (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)node_ptr_01);
        break;
      }
    case 5:
    case 6:
      PropagateChildren((StatisticsPropagator *)&compressed_materialization,node,node_ptr);
    }
  }
  pOVar2 = compressed_materialization.optimizer;
  compressed_materialization.optimizer = (Optimizer *)0x0;
  ::std::__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  reset((__uniq_ptr_impl<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
        this,(pointer)pOVar2);
  ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  ~unique_ptr((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_> *)
              &compressed_materialization);
  bVar3 = Optimizer::OptimizerDisabled
                    ((Optimizer *)node->_vptr_LogicalOperator,COMPRESSED_MATERIALIZATION);
  if (!bVar3) {
    pOVar2 = (Optimizer *)node->_vptr_LogicalOperator;
    root_p = optional_ptr<duckdb::LogicalOperator,_true>::operator*
                       ((optional_ptr<duckdb::LogicalOperator,_true> *)&node->children);
    CompressedMaterialization::CompressedMaterialization
              (&compressed_materialization,pOVar2,root_p,
               (statistics_map_t *)
               &(node->children).
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    CompressedMaterialization::Compress(&compressed_materialization,in_RCX);
  }
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalOperator &node,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	unique_ptr<NodeStatistics> result;
	switch (node.type) {
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		result = PropagateStatistics(node.Cast<LogicalAggregate>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		result = PropagateStatistics(node.Cast<LogicalCrossProduct>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_FILTER:
		result = PropagateStatistics(node.Cast<LogicalFilter>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_GET:
		result = PropagateStatistics(node.Cast<LogicalGet>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_PROJECTION:
		result = PropagateStatistics(node.Cast<LogicalProjection>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
	case LogicalOperatorType::LOGICAL_JOIN:
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		result = PropagateStatistics(node.Cast<LogicalJoin>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		result = PropagateStatistics(node.Cast<LogicalPositionalJoin>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_UNION:
	case LogicalOperatorType::LOGICAL_EXCEPT:
	case LogicalOperatorType::LOGICAL_INTERSECT:
		result = PropagateStatistics(node.Cast<LogicalSetOperation>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		result = PropagateStatistics(node.Cast<LogicalOrder>(), node_ptr);
		break;
	case LogicalOperatorType::LOGICAL_WINDOW:
		result = PropagateStatistics(node.Cast<LogicalWindow>(), node_ptr);
		break;
	default:
		result = PropagateChildren(node, node_ptr);
	}

	if (!optimizer.OptimizerDisabled(OptimizerType::COMPRESSED_MATERIALIZATION)) {
		// compress data based on statistics for materializing operators
		CompressedMaterialization compressed_materialization(optimizer, *root, statistics_map);
		compressed_materialization.Compress(node_ptr);
	}

	return result;
}